

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_REG_RPTR(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1,x86Size size,
                     x86Reg index,int multiplier,x86Reg base,uint shift)

{
  x86Instruction *pxVar1;
  x86Argument arg;
  uint uVar2;
  int iVar3;
  x86Reg xVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  x86XmmReg reg2;
  x86Reg xVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  x86Argument *this;
  x86Command xStackY_d0;
  x86Argument newArg;
  int multiplier_local;
  x86Reg index_local;
  x86Argument local_50;
  
  multiplier_local = multiplier;
  index_local = index;
  CodeGenGenericContext::RedirectAddressComputation(ctx,&index_local,&multiplier_local,&base,&shift)
  ;
  xVar4 = index_local;
  iVar3 = multiplier_local;
  uVar2 = shift;
  xVar8 = base;
  uVar9 = (ulong)index_local;
  uVar10 = (ulong)base;
  newArg.type = argPtr;
  newArg.ptrBase = base;
  newArg.ptrIndex = index_local;
  newArg.ptrMult = multiplier_local;
  newArg.ptrNum = shift;
  newArg.field_1.ptrSize = size;
  local_50.field_1.ptrSize = size;
  switch(op) {
  case o_movss:
  case o_movsd:
    uVar6 = CodeGenGenericContext::MemFind(ctx,&newArg);
    if ((uVar6 == 0) || (uVar7 = (ulong)(uVar6 - 1), ctx->memCache[uVar7].value.type != argXmmReg))
    {
      this = ctx->xmmReg;
      for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
        if ((this->type == argPtr) && (bVar5 = x86Argument::operator==(this,&newArg), bVar5)) {
          EMIT_OP_REG_REG(ctx,op,reg1,(x86XmmReg)lVar11);
          return;
        }
        this = this + 1;
      }
      ctx->genRegRead[uVar10] = true;
      ctx->genRegRead[uVar9] = true;
      local_50.type = argPtr;
      local_50.ptrBase = xVar8;
      local_50.ptrIndex = xVar4;
      local_50.ptrMult = iVar3;
      local_50.ptrNum = uVar2;
      CodeGenGenericContext::MemRead(ctx,&local_50);
      arg._4_4_ = newArg._4_4_;
      arg.type = newArg.type;
      arg.field_1.imm64Arg._4_4_ = newArg.field_1.imm64Arg._4_4_;
      arg.field_1.reg = newArg.field_1.reg;
      arg.ptrIndex = newArg.ptrIndex;
      arg.ptrBase = newArg.ptrBase;
      arg.ptrNum = newArg.ptrNum;
      arg.ptrMult = newArg.ptrMult;
      CodeGenGenericContext::OverwriteRegisterWithValue(ctx,reg1,arg);
      goto LAB_001caff5;
    }
    break;
  case o_movd:
  case o_movsxd:
  case o_cvttsd2si:
switchD_001cad18_caseD_36:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x6b8,
                  "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                 );
  case o_cvtss2sd:
  case o_cvtsd2ss:
    uVar6 = CodeGenGenericContext::MemFind(ctx,&newArg);
    if ((uVar6 == 0) || (uVar7 = (ulong)(uVar6 - 1), ctx->memCache[uVar7].value.type != argXmmReg))
    goto LAB_001caf38;
    break;
  case o_cvtsi2sd:
    uVar6 = CodeGenGenericContext::MemFind(ctx,&newArg);
    if ((uVar6 != 0) && (uVar6 = uVar6 - 1, ctx->memCache[uVar6].value.type == argReg)) {
      if (ctx->memCache[uVar6].address.field_1.reg != rECX) {
        __assert_fail("ctx.memCache[memIndex].address.ptrSize == sDWORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x657,
                      "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                     );
      }
      xVar8 = ctx->memCache[uVar6].value.field_1.reg;
      xStackY_d0 = o_cvtsi2sd;
LAB_001caf1e:
      EMIT_OP_REG_REG(ctx,xStackY_d0,reg1,xVar8);
      return;
    }
    goto LAB_001caf38;
  case o_addsd:
  case o_subsd:
  case o_mulsd:
  case o_divsd:
  case o_sqrtsd:
  case o_cmpeqsd:
  case o_cmpltsd:
  case o_cmplesd:
  case o_cmpneqsd:
    uVar6 = CodeGenGenericContext::MemFind(ctx,&newArg);
    if ((uVar6 == 0) || (ctx->memCache[uVar6 - 1].value.type != argXmmReg)) {
      ctx->genRegRead[uVar10] = true;
      ctx->genRegRead[uVar9] = true;
      local_50.type = argPtr;
      local_50.ptrBase = xVar8;
      local_50.ptrIndex = xVar4;
      local_50.ptrMult = iVar3;
      local_50.ptrNum = uVar2;
      CodeGenGenericContext::MemRead(ctx,&local_50);
      CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
      goto LAB_001caff5;
    }
    reg2 = ctx->memCache[uVar6 - 1].value.field_1.xmmArg;
    goto LAB_001cae2d;
  default:
    if (op != o_cvtsi2sd64) goto switchD_001cad18_caseD_36;
    uVar6 = CodeGenGenericContext::MemFind(ctx,&newArg);
    if ((uVar6 != 0) && (uVar6 = uVar6 - 1, ctx->memCache[uVar6].value.type == argReg)) {
      if (ctx->memCache[uVar6].address.field_1.reg != rEDX) {
        __assert_fail("ctx.memCache[memIndex].address.ptrSize == sQWORD",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x66d,
                      "void EMIT_OP_REG_RPTR(CodeGenGenericContext &, x86Command, x86XmmReg, x86Size, x86Reg, int, x86Reg, unsigned int)"
                     );
      }
      xVar8 = ctx->memCache[uVar6].value.field_1.reg;
      xStackY_d0 = o_cvtsi2sd64;
      goto LAB_001caf1e;
    }
LAB_001caf38:
    ctx->genRegRead[uVar10] = true;
    ctx->genRegRead[uVar9] = true;
    local_50.type = argPtr;
    local_50.ptrBase = xVar8;
    local_50.ptrIndex = xVar4;
    local_50.ptrMult = iVar3;
    local_50.ptrNum = uVar2;
    CodeGenGenericContext::MemRead(ctx,&local_50);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
LAB_001caff5:
    pxVar1 = ctx->x86Op;
    pxVar1->name = op;
    (pxVar1->argA).type = argXmmReg;
    (pxVar1->argA).field_1.xmmArg = reg1;
    pxVar1 = ctx->x86Op;
    (pxVar1->argB).type = argPtr;
    (pxVar1->argB).field_1.ptrSize = size;
    pxVar1 = ctx->x86Op;
    (pxVar1->argB).ptrIndex = xVar4;
    (pxVar1->argB).ptrMult = iVar3;
    (pxVar1->argB).ptrBase = xVar8;
    (pxVar1->argB).ptrNum = uVar2;
    ctx->x86Op = pxVar1 + 1;
    return;
  }
  reg2 = ctx->memCache[uVar7].value.field_1.xmmArg;
LAB_001cae2d:
  EMIT_OP_REG_REG(ctx,op,reg1,reg2);
  return;
}

Assistant:

void EMIT_OP_REG_RPTR(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	x86Argument newArg = x86Argument(size, index, multiplier, base, shift);

	switch(op)
	{
	case o_cvtss2sd:
	case o_cvtsd2ss:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvtsi2sd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == sDWORD);

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_cvtsi2sd64:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argReg)
			{
				assert(ctx.memCache[memIndex].address.ptrSize == sQWORD);

				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.reg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_movss:
	case o_movsd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// If another register contains data from memory
		for(unsigned i = 0; i < rXmmRegCount; i++)
		{
			if(ctx.xmmReg[i].type == x86Argument::argPtr && ctx.xmmReg[i] == newArg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, (x86XmmReg)i);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.OverwriteRegisterWithValue(reg1, newArg);
		break;
	case o_addsd:
	case o_subsd:
	case o_mulsd:
	case o_divsd:
	case o_sqrtsd:
	case o_cmpeqsd:
	case o_cmpltsd:
	case o_cmplesd:
	case o_cmpneqsd:
		if(unsigned memIndex = ctx.MemFind(newArg))
		{
			memIndex--;

			if(ctx.memCache[memIndex].value.type == x86Argument::argXmmReg)
			{
				EMIT_OP_REG_REG(ctx, op, reg1, ctx.memCache[memIndex].value.xmmArg);
				return;
			}
		}

		// Register reads
		ctx.ReadRegister(base);
		ctx.ReadRegister(index);

		ctx.MemRead(x86Argument(size, index, multiplier, base, shift));

		ctx.ReadAndModifyRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argPtr;
	ctx.x86Op->argB.ptrSize = size;
	ctx.x86Op->argB.ptrIndex = index;
	ctx.x86Op->argB.ptrMult = multiplier;
	ctx.x86Op->argB.ptrBase = base;
	ctx.x86Op->argB.ptrNum = shift;
	ctx.x86Op++;
}